

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_remove_all_buffer_blocks(filemgr *file)

{
  __pointer_type pfVar1;
  filemgr *in_stack_00000008;
  filemgr *in_stack_00000010;
  
  if (0 < global_config.ncacheblock) {
    pfVar1 = std::atomic<fnamedic_item_*>::load
                       ((atomic<fnamedic_item_*> *)in_stack_00000008,file._4_4_);
    if (pfVar1 != (__pointer_type)0x0) {
      bcache_remove_dirty_blocks(file);
      bcache_remove_clean_blocks(in_stack_00000010);
      bcache_remove_file(in_stack_00000008);
      std::atomic<fnamedic_item_*>::store
                ((atomic<fnamedic_item_*> *)in_stack_00000010,(__pointer_type)in_stack_00000008,
                 file._4_4_);
    }
  }
  return;
}

Assistant:

void filemgr_remove_all_buffer_blocks(struct filemgr *file)
{
    // remove all cached blocks
    if (global_config.ncacheblock > 0 &&
            file->bcache.load(std::memory_order_relaxed)) {
        bcache_remove_dirty_blocks(file);
        bcache_remove_clean_blocks(file);
        bcache_remove_file(file);
        file->bcache.store(NULL, std::memory_order_relaxed);
    }
}